

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O2

void __thiscall
Assimp::DeboneProcess::SplitMesh
          (DeboneProcess *this,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
          *poNewMeshes)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  aiVertexWeight *paVar6;
  uint uVar7;
  Logger *this_00;
  ulong *puVar8;
  aiFace *paVar9;
  aiMesh *mesh;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint j;
  uint uVar13;
  ulong uVar14;
  undefined4 uVar15;
  aiMesh *this_01;
  uint i;
  ulong uVar16;
  uint j_1;
  reference rVar17;
  int local_dc;
  pair<aiMesh_*,_const_aiBone_*> push_pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faceBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> facesPerBone;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  vector<bool,_std::allocator<bool>_> isBoneNecessary;
  
  vertexBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&isBoneNecessary,(ulong)pMesh->mNumBones,(bool *)&vertexBones,
             (allocator_type *)&faceBones);
  faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vertexBones,(ulong)pMesh->mNumVertices,(value_type_conflict1 *)&faceBones,
             (allocator_type *)&facesPerBone);
  uVar16 = 0;
  do {
    if (pMesh->mNumBones <= uVar16) {
      facesPerBone.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&faceBones,(ulong)pMesh->mNumFaces,(value_type_conflict1 *)&facesPerBone,
                 (allocator_type *)&subFaces);
      subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&facesPerBone,(ulong)pMesh->mNumBones,(value_type_conflict1 *)&subFaces,
                 (allocator_type *)&push_pair);
      local_dc = 0;
      for (uVar16 = 0; uVar14 = (ulong)pMesh->mNumFaces, uVar16 < uVar14; uVar16 = uVar16 + 1) {
        paVar9 = pMesh->mFaces;
        uVar10 = *(uint *)(CONCAT71(vertexBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    vertexBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_1_) +
                          (ulong)*paVar9[uVar16].mIndices * 4);
        uVar14 = 1;
        uVar13 = 1;
        while( true ) {
          if (paVar9[uVar16].mNumIndices <= uVar14) break;
          uVar4 = *(uint *)(CONCAT71(vertexBones.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     vertexBones.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           (ulong)paVar9[uVar16].mIndices[uVar14] * 4);
          if (uVar10 == uVar4) {
            uVar13 = uVar13 + 1;
          }
          else {
            uVar7 = pMesh->mNumBones;
            if (uVar10 < uVar7) {
              rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&isBoneNecessary,(ulong)uVar10);
              *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
              uVar7 = pMesh->mNumBones;
            }
            if (uVar4 < uVar7) {
              rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&isBoneNecessary,(ulong)uVar4);
              *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
            }
          }
          uVar14 = uVar14 + 1;
          paVar9 = pMesh->mFaces;
        }
        if ((uVar10 < pMesh->mNumBones) && (uVar13 == paVar9[uVar16].mNumIndices)) {
          *(uint *)(CONCAT44(faceBones.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             faceBones.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_4_) + uVar16 * 4) = uVar10;
          piVar1 = (int *)(CONCAT44(facesPerBone.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    facesPerBone.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) +
                          (ulong)uVar10 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          local_dc = local_dc + 1;
        }
      }
      uVar16 = 0;
      do {
        if (uVar14 <= uVar16) {
          if (local_dc != 0) {
            subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (uVar10 = 0; push_pair.first = (aiMesh *)CONCAT44(push_pair.first._4_4_,uVar10),
                uVar10 < (uint)uVar14; uVar10 = uVar10 + 1) {
              if (*(int *)(CONCAT44(faceBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    faceBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) +
                          (ulong)uVar10 * 4) == -1) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&subFaces,(value_type_conflict1 *)&push_pair);
                uVar14 = (ulong)pMesh->mNumFaces;
                uVar10 = (uint)push_pair.first;
              }
            }
            push_pair.first = MakeSubmesh(pMesh,&subFaces,0);
            push_pair.second = (aiBone *)0x0;
            std::
            vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
            ::push_back(poNewMeshes,&push_pair);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          }
          for (uVar16 = 0; uVar16 < pMesh->mNumBones; uVar16 = uVar16 + 1) {
            rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&isBoneNecessary,uVar16);
            if (((*rVar17._M_p & rVar17._M_mask) == 0) &&
               (*(int *)(CONCAT44(facesPerBone.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  facesPerBone.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar16 * 4) != 0
               )) {
              subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              for (uVar10 = 0; push_pair.first = (aiMesh *)CONCAT44(push_pair.first._4_4_,uVar10),
                  uVar10 < pMesh->mNumFaces; uVar10 = uVar10 + 1) {
                if (uVar16 == *(uint *)(CONCAT44(faceBones.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 faceBones.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       (ulong)uVar10 * 4)) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &subFaces.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                             (value_type_conflict1 *)&push_pair);
                  uVar10 = (uint)push_pair.first;
                }
              }
              this_01 = pMesh;
              mesh = MakeSubmesh(pMesh,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &subFaces.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ,1);
              ApplyTransform((DeboneProcess *)this_01,mesh,&pMesh->mBones[uVar16]->mOffsetMatrix);
              push_pair.second = pMesh->mBones[uVar16];
              push_pair.first = mesh;
              std::
              vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
              ::push_back(poNewMeshes,&push_pair);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&subFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            }
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&facesPerBone.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&vertexBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&isBoneNecessary.super__Bvector_base<std::allocator<bool>_>);
          return;
        }
        uVar10 = *(uint *)(CONCAT44(faceBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    faceBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar16 * 4);
        if (uVar10 < pMesh->mNumBones) {
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&isBoneNecessary,(ulong)uVar10);
          if ((*rVar17._M_p & rVar17._M_mask) != 0) {
            uVar14 = (ulong)*(uint *)(CONCAT44(faceBones.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               faceBones.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     uVar16 * 4);
            iVar5 = *(int *)(CONCAT44(facesPerBone.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      facesPerBone.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar14 * 4)
            ;
            if (iVar5 == 0) {
              __assert_fail("facesPerBone[faceBones[i]]>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/DeboneProcess.cpp"
                            ,0x149,
                            "void Assimp::DeboneProcess::SplitMesh(const aiMesh *, std::vector<std::pair<aiMesh *, const aiBone *>> &) const"
                           );
            }
            *(int *)(CONCAT44(facesPerBone.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              facesPerBone.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) =
                 iVar5 + -1;
            local_dc = local_dc + 1;
            *(undefined4 *)
             (CONCAT44(faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       faceBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar16 * 4) = 0xffffffff;
          }
        }
        uVar16 = uVar16 + 1;
        uVar14 = (ulong)pMesh->mNumFaces;
      } while( true );
    }
    for (uVar14 = 0; uVar14 < pMesh->mBones[uVar16]->mNumWeights; uVar14 = uVar14 + 1) {
      paVar6 = pMesh->mBones[uVar16]->mWeights;
      fVar2 = paVar6[uVar14].mWeight;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        if (this->mThreshold <= fVar2) {
          uVar12 = (ulong)paVar6[uVar14].mVertexId;
          uVar11 = (ulong)*(uint *)(CONCAT71(vertexBones.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             vertexBones.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                   uVar12 * 4);
          uVar15 = (undefined4)uVar16;
          if (uVar11 != 0xffffffff) {
            uVar15 = 0xfffffffe;
            if (uVar16 == uVar11) {
              this_00 = DefaultLogger::get();
              Logger::warn(this_00,"Encountered double entry in bone weights");
              goto LAB_003c053f;
            }
          }
          *(undefined4 *)
           (CONCAT71(vertexBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                     vertexBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar12 * 4) = uVar15;
        }
LAB_003c053f:
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&isBoneNecessary,uVar16);
        if ((*rVar17._M_p & rVar17._M_mask) == 0) {
          fVar3 = this->mThreshold;
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&isBoneNecessary,uVar16);
          puVar8 = rVar17._M_p;
          if (fVar3 <= fVar2) {
            uVar12 = ~rVar17._M_mask & *puVar8;
          }
          else {
            uVar12 = rVar17._M_mask | *puVar8;
          }
          *puVar8 = uVar12;
        }
      }
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void DeboneProcess::SplitMesh( const aiMesh* pMesh, std::vector< std::pair< aiMesh*,const aiBone* > >& poNewMeshes) const
{
    // same deal here as ConsiderMesh basically

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;

            if(w>=mThreshold) {
                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }
    }

    unsigned int nFacesUnowned = 0;

    std::vector<unsigned int> faceBones(pMesh->mNumFaces,UINT_MAX);
    std::vector<unsigned int> facesPerBone(pMesh->mNumBones,0);

    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        unsigned int nInterstitial = 1;

        unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

        for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
            unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

            if(v!=w)    {
                if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
            }
            else nInterstitial++;
        }

        if(v<pMesh->mNumBones &&nInterstitial==pMesh->mFaces[i].mNumIndices)    {
            faceBones[i] = v; //primitive belongs to bone #v
            facesPerBone[v]++;
        }
        else nFacesUnowned++;
    }

    // invalidate any "cojoined" faces
    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        if(faceBones[i]<pMesh->mNumBones&&isBoneNecessary[faceBones[i]])
        {
            ai_assert(facesPerBone[faceBones[i]]>0);
            facesPerBone[faceBones[i]]--;

            nFacesUnowned++;
            faceBones[i] = cUnowned;
        }
    }

    if(nFacesUnowned) {
        std::vector<unsigned int> subFaces;

        for(unsigned int i=0;i<pMesh->mNumFaces;i++)    {
            if(faceBones[i]==cUnowned) {
                subFaces.push_back(i);
            }
        }

        aiMesh *baseMesh = MakeSubmesh(pMesh,subFaces,0);
        std::pair<aiMesh*,const aiBone*> push_pair(baseMesh,(const aiBone*)0);

        poNewMeshes.push_back(push_pair);
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++) {

        if(!isBoneNecessary[i]&&facesPerBone[i]>0)  {
            std::vector<unsigned int> subFaces;

            for(unsigned int j=0;j<pMesh->mNumFaces;j++)    {
                if(faceBones[j]==i) {
                    subFaces.push_back(j);
                }
            }

            unsigned int f = AI_SUBMESH_FLAGS_SANS_BONES;
            aiMesh *subMesh =MakeSubmesh(pMesh,subFaces,f);

            //Lifted from PretransformVertices.cpp
            ApplyTransform(subMesh,pMesh->mBones[i]->mOffsetMatrix);
            std::pair<aiMesh*,const aiBone*> push_pair(subMesh,pMesh->mBones[i]);

            poNewMeshes.push_back(push_pair);
        }
    }
}